

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ForLoopStatementSyntax *pFVar1;
  BumpAllocator *unaff_RBX;
  Token TVar2;
  Token *in_stack_00000020;
  ExpressionSyntax **in_stack_00000028;
  Token *in_stack_00000030;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *in_stack_00000038;
  Token *in_stack_00000040;
  StatementSyntax *in_stack_00000048;
  BumpAllocator *in_stack_00000068;
  SeparatedSyntaxList<slang::syntax::SyntaxNode> *in_stack_00000070;
  BumpAllocator *in_stack_ffffffffffffff18;
  StatementSyntax *in_stack_ffffffffffffff20;
  NamedLabelSyntax *local_98;
  BumpAllocator *in_stack_ffffffffffffffc0;
  
  if (*(long *)(__fn + 0x18) == 0) {
    local_98 = (NamedLabelSyntax *)0x0;
  }
  else {
    local_98 = deepClone<slang::syntax::NamedLabelSyntax>
                         ((NamedLabelSyntax *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  }
  deepClone<slang::syntax::AttributeInstanceSyntax>
            ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_98,
             in_stack_ffffffffffffffc0);
  TVar2 = parsing::Token::deepClone((Token *)in_stack_00000070,in_stack_00000068);
  parsing::Token::deepClone((Token *)in_stack_00000070,in_stack_00000068);
  deepClone<slang::syntax::SyntaxNode>(in_stack_00000070,in_stack_00000068);
  parsing::Token::deepClone((Token *)in_stack_00000070,in_stack_00000068);
  if (*(NamedLabelSyntax **)((long)__fn + 0xc0) != (NamedLabelSyntax *)0x0) {
    deepClone<slang::syntax::ExpressionSyntax>
              ((ExpressionSyntax *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  }
  parsing::Token::deepClone((Token *)in_stack_00000070,in_stack_00000068);
  deepClone<slang::syntax::ExpressionSyntax>
            ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)in_stack_00000070,
             in_stack_00000068);
  parsing::Token::deepClone((Token *)in_stack_00000070,in_stack_00000068);
  not_null<slang::syntax::StatementSyntax_*>::operator*
            ((not_null<slang::syntax::StatementSyntax_*> *)0x81aad4);
  deepClone<slang::syntax::StatementSyntax>(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  pFVar1 = BumpAllocator::
           emplace<slang::syntax::ForLoopStatementSyntax,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>&,slang::parsing::Token,slang::syntax::ExpressionSyntax*,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>&,slang::parsing::Token,slang::syntax::StatementSyntax&>
                     (unaff_RBX,(NamedLabelSyntax **)__fn,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)__child_stack,
                      (Token *)local_98,(Token *)TVar2.info,TVar2._0_8_,in_stack_00000020,
                      in_stack_00000028,in_stack_00000030,in_stack_00000038,in_stack_00000040,
                      in_stack_00000048);
  return (int)pFVar1;
}

Assistant:

static SyntaxNode* clone(const ForLoopStatementSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ForLoopStatementSyntax>(
        node.label ? deepClone(*node.label, alloc) : nullptr,
        *deepClone(node.attributes, alloc),
        node.forKeyword.deepClone(alloc),
        node.openParen.deepClone(alloc),
        *deepClone(node.initializers, alloc),
        node.semi1.deepClone(alloc),
        node.stopExpr ? deepClone(*node.stopExpr, alloc) : nullptr,
        node.semi2.deepClone(alloc),
        *deepClone(node.steps, alloc),
        node.closeParen.deepClone(alloc),
        *deepClone<StatementSyntax>(*node.statement, alloc)
    );
}